

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Property.hh
# Opt level: O3

size_t __thiscall OpenMesh::PropertyT<float>::size_of(PropertyT<float> *this)

{
  pointer pfVar1;
  pointer pfVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  size_t sVar5;
  
  iVar3 = (*(this->super_BaseProperty)._vptr_BaseProperty[0xc])();
  if (CONCAT44(extraout_var,iVar3) == -1) {
    pfVar1 = (this->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    pfVar2 = (this->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pfVar1 == pfVar2) {
      sVar5 = 0;
    }
    else {
      sVar5 = (long)pfVar2 - (long)pfVar1 & 0xfffffffffffffffc;
    }
  }
  else {
    iVar3 = (*(this->super_BaseProperty)._vptr_BaseProperty[0xb])(this);
    iVar4 = (*(this->super_BaseProperty)._vptr_BaseProperty[0xc])(this);
    if (CONCAT44(extraout_var_01,iVar4) == -1) {
      sVar5 = 0xffffffffffffffff;
    }
    else {
      iVar4 = (*(this->super_BaseProperty)._vptr_BaseProperty[0xc])(this);
      sVar5 = CONCAT44(extraout_var_02,iVar4) * CONCAT44(extraout_var_00,iVar3);
    }
  }
  return sVar5;
}

Assistant:

virtual size_t size_of(void) const
  {
    if (element_size() != IO::UnknownSize)
      return this->BaseProperty::size_of(n_elements());
    return std::accumulate(data_.begin(), data_.end(), size_t(0), plus());
  }